

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,StringTree *params_4,ArrayPtr<const_char> *params_5,
          String *params_6,ArrayPtr<const_char> *params_7,ArrayPtr<const_char> *params_8,
          ArrayPtr<const_char> *params_9,ArrayPtr<const_char> *params_10,
          ArrayPtr<const_char> *params_11,String *params_12,ArrayPtr<const_char> *params_13,
          StringTree *params_14,StringTree *params_15,StringTree *params_16,
          ArrayPtr<const_char> *params_17,ArrayPtr<const_char> *params_18,
          ArrayPtr<const_char> *params_19,String *params_20,ArrayPtr<const_char> *params_21,
          String *params_22,ArrayPtr<const_char> *params_23,ArrayPtr<const_char> *params_24,
          ArrayPtr<const_char> *params_25,StringTree *params_26,ArrayPtr<const_char> *params_27)

{
  size_t sVar1;
  StringTree *pSVar2;
  ArrayPtr<const_char> *pAVar3;
  String *pSVar4;
  char *pos;
  ArrayPtr<const_char> *rest_1;
  ArrayPtr<const_char> *rest_2;
  StringTree *rest_3;
  ArrayPtr<const_char> *rest_4;
  ArrayPtr<const_char> *rest_6;
  ArrayPtr<const_char> *rest_7;
  ArrayPtr<const_char> *rest_8;
  ArrayPtr<const_char> *rest_9;
  ArrayPtr<const_char> *rest_10;
  String *rest_11;
  ArrayPtr<const_char> *rest_12;
  StringTree *rest_13;
  StringTree *rest_14;
  StringTree *rest_15;
  ArrayPtr<const_char> *rest_16;
  ArrayPtr<const_char> *rest_17;
  ArrayPtr<const_char> *rest_18;
  String *rest_19;
  ArrayPtr<const_char> *rest_20;
  String *rest_21;
  ArrayPtr<const_char> *rest_22;
  ArrayPtr<const_char> *rest_23;
  ArrayPtr<const_char> *rest_24;
  StringTree *rest_25;
  ArrayPtr<const_char> *rest_26;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_378;
  size_t local_370;
  size_t local_368;
  size_t local_360;
  size_t local_358;
  size_t local_350;
  size_t local_348;
  size_t local_340;
  size_t local_338;
  size_t local_330;
  size_t local_328;
  size_t local_320;
  size_t local_318;
  size_t local_310;
  size_t local_308;
  size_t local_300;
  size_t local_2f8;
  size_t local_2f0;
  size_t local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  size_t local_2c0;
  size_t local_2b8;
  size_t local_2b0;
  size_t local_2a8;
  size_t local_2a0;
  _ *local_298;
  undefined8 local_290;
  Array<kj::StringTree::Branch> local_288;
  size_t local_270;
  size_t local_268;
  size_t local_260;
  size_t local_258;
  size_t local_250;
  size_t local_248;
  size_t local_240;
  size_t local_238;
  size_t local_230;
  size_t local_228;
  size_t local_220;
  size_t local_218;
  size_t local_210;
  size_t local_208;
  size_t local_200;
  size_t local_1f8;
  size_t local_1f0;
  size_t local_1e8;
  size_t local_1e0;
  size_t local_1d8;
  size_t local_1d0;
  size_t local_1c8;
  size_t local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  size_t local_1a0;
  size_t local_198;
  _ *local_190;
  undefined8 local_188;
  String local_180;
  size_t local_158;
  size_t local_150;
  size_t local_148;
  size_t local_140;
  size_t local_138;
  size_t local_130;
  size_t local_128;
  size_t local_120;
  size_t local_118;
  size_t local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  _ *local_78;
  undefined8 local_70;
  undefined1 local_61;
  StringTree *local_60;
  StringTree *params_local_4;
  ArrayPtr<const_char> *params_local_3;
  ArrayPtr<const_char> *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  StringTree *params_local;
  StringTree *result;
  
  local_61 = 0;
  local_60 = (StringTree *)params_3;
  params_local_4 = (StringTree *)params_2;
  params_local_3 = params_1;
  params_local_2 = (ArrayPtr<const_char> *)params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = __return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_158 = size((StringTree *)params_local_1);
  local_150 = ArrayPtr<const_char>::size(params_local_2);
  local_148 = ArrayPtr<const_char>::size(params_local_3);
  local_140 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_4);
  local_138 = size(local_60);
  local_130 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_4);
  local_128 = String::size((String *)params_5);
  local_120 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_6);
  local_118 = ArrayPtr<const_char>::size(params_7);
  local_110 = ArrayPtr<const_char>::size(params_8);
  local_108 = ArrayPtr<const_char>::size(params_9);
  local_100 = ArrayPtr<const_char>::size(params_10);
  local_f8 = String::size((String *)params_11);
  local_f0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_12);
  local_e8 = size((StringTree *)params_13);
  local_e0 = size(params_14);
  local_d8 = size(params_15);
  local_d0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_16);
  local_c8 = ArrayPtr<const_char>::size(params_17);
  local_c0 = ArrayPtr<const_char>::size(params_18);
  local_b8 = String::size((String *)params_19);
  local_b0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_20);
  local_a8 = String::size((String *)params_21);
  local_a0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_22);
  local_98 = ArrayPtr<const_char>::size(params_23);
  local_90 = ArrayPtr<const_char>::size(params_24);
  local_88 = size((StringTree *)params_25);
  local_80 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_26);
  local_78 = (_ *)&local_158;
  local_70 = 0x1c;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x1c;
  sVar1 = _::sum(local_78,nums);
  __return_storage_ptr__->size_ = sVar1;
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_1);
  local_270 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  local_268 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_260 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_4);
  local_258 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(local_60);
  local_250 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_4);
  local_248 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_5);
  local_240 = flatSize(pSVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_6);
  local_238 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_7);
  local_230 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_8);
  local_228 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_9);
  local_220 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_10);
  local_218 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_11);
  local_210 = flatSize(pSVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_12);
  local_208 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_13);
  local_200 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>(params_14);
  local_1f8 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>(params_15);
  local_1f0 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_16);
  local_1e8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_17);
  local_1e0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_18);
  local_1d8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_19);
  local_1d0 = flatSize(pSVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_20);
  local_1c8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_21);
  local_1c0 = flatSize(pSVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_22);
  local_1b8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_23);
  local_1b0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_24);
  local_1a8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_25);
  local_1a0 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_26);
  local_198 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  local_190 = (_ *)&local_270;
  local_188 = 0x1c;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x1c;
  sVar1 = _::sum(local_190,nums_00);
  heapString(&local_180,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_180);
  String::~String(&local_180);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_1);
  local_378 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  local_370 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_368 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_4);
  local_360 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(local_60);
  local_358 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_4);
  local_350 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_5);
  local_348 = branchCount(pSVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_6);
  local_340 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_7);
  local_338 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_8);
  local_330 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_9);
  local_328 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_10);
  local_320 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_11);
  local_318 = branchCount(pSVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_12);
  local_310 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_13);
  local_308 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>(params_14);
  local_300 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>(params_15);
  local_2f8 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_16);
  local_2f0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_17);
  local_2e8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_18);
  local_2e0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_19);
  local_2d8 = branchCount(pSVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_20);
  local_2d0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_21);
  local_2c8 = branchCount(pSVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_22);
  local_2c0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_23);
  local_2b8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_24);
  local_2b0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_25);
  local_2a8 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_26);
  local_2a0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  local_298 = (_ *)&local_378;
  local_290 = 0x1c;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x1c;
  sVar1 = _::sum(local_298,nums_01);
  heapArray<kj::StringTree::Branch>(&local_288,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_288);
  Array<kj::StringTree::Branch>::~Array(&local_288);
  pos = String::begin(&__return_storage_ptr__->text);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_1);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  rest_1 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  rest_2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_4);
  rest_3 = fwd<kj::StringTree>(local_60);
  rest_4 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_4);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_5);
  rest_6 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_6);
  rest_7 = fwd<kj::ArrayPtr<char_const>>(params_7);
  rest_8 = fwd<kj::ArrayPtr<char_const>>(params_8);
  rest_9 = fwd<kj::ArrayPtr<char_const>>(params_9);
  rest_10 = fwd<kj::ArrayPtr<char_const>>(params_10);
  rest_11 = fwd<kj::String>((NoInfer<kj::String> *)params_11);
  rest_12 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_12);
  rest_13 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_13);
  rest_14 = fwd<kj::StringTree>(params_14);
  rest_15 = fwd<kj::StringTree>(params_15);
  rest_16 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_16);
  rest_17 = fwd<kj::ArrayPtr<char_const>>(params_17);
  rest_18 = fwd<kj::ArrayPtr<char_const>>(params_18);
  rest_19 = fwd<kj::String>((NoInfer<kj::String> *)params_19);
  rest_20 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_20);
  rest_21 = fwd<kj::String>((NoInfer<kj::String> *)params_21);
  rest_22 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_22);
  rest_23 = fwd<kj::ArrayPtr<char_const>>(params_23);
  rest_24 = fwd<kj::ArrayPtr<char_const>>(params_24);
  rest_25 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_25);
  rest_26 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_26);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,pSVar2,pAVar3,rest_1,rest_2,rest_3,rest_4,pSVar4,rest_6,
             rest_7,rest_8,rest_9,rest_10,rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,
             rest_18,rest_19,rest_20,rest_21,rest_22,rest_23,rest_24,rest_25,rest_26);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}